

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int gen_publickey_from_dsa_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,EVP_PKEY *pk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  dsa_st *r;
  uchar *puVar6;
  uchar *buf;
  uchar *puVar7;
  BIGNUM *pub_key;
  BIGNUM *g;
  BIGNUM *q;
  BIGNUM *p_bn;
  BIGNUM *local_50;
  BIGNUM *local_48;
  BIGNUM *local_40;
  BIGNUM *local_38;
  
  r = EVP_PKEY_get1_DSA((EVP_PKEY *)pk);
  if (r != (dsa_st *)0x0) {
    puVar6 = (uchar *)(*session->alloc)(7,&session->abstract);
    if (puVar6 == (uchar *)0x0) {
      DSA_free(r);
    }
    else {
      DSA_get0_pqg(r,&local_38,&local_40,&local_48);
      DSA_get0_key(r,&local_50,0);
      iVar1 = BN_num_bits(local_38);
      iVar5 = iVar1 + 0xe;
      if (-1 < iVar1 + 7) {
        iVar5 = iVar1 + 7;
      }
      iVar2 = BN_num_bits(local_40);
      iVar1 = iVar2 + 0xe;
      if (-1 < iVar2 + 7) {
        iVar1 = iVar2 + 7;
      }
      iVar3 = BN_num_bits(local_48);
      iVar2 = iVar3 + 0xe;
      if (-1 < iVar3 + 7) {
        iVar2 = iVar3 + 7;
      }
      iVar4 = BN_num_bits(local_50);
      iVar3 = iVar4 + 0xe;
      if (-1 < iVar4 + 7) {
        iVar3 = iVar4 + 7;
      }
      buf = (uchar *)(*session->alloc)((long)((iVar2 >> 3) + (iVar5 >> 3) + (iVar1 >> 3) +
                                              (iVar3 >> 3) + 0x1f),&session->abstract);
      if (buf != (uchar *)0x0) {
        _libssh2_htonu32(buf,7);
        builtin_memcpy(buf + 4,"ssh-dss",7);
        puVar7 = write_bn(buf + 0xb,(BIGNUM *)local_38,(iVar5 >> 3) + 1);
        puVar7 = write_bn(puVar7,(BIGNUM *)local_40,(iVar1 >> 3) + 1);
        puVar7 = write_bn(puVar7,(BIGNUM *)local_48,(iVar2 >> 3) + 1);
        puVar7 = write_bn(puVar7,(BIGNUM *)local_50,(iVar3 >> 3) + 1);
        DSA_free(r);
        builtin_memcpy(puVar6,"ssh-dss",7);
        *method = puVar6;
        *method_len = 7;
        *pubkeydata = buf;
        *pubkeydata_len = (long)puVar7 - (long)buf;
        return 0;
      }
      DSA_free(r);
      (*session->free)(puVar6,&session->abstract);
    }
  }
  iVar5 = _libssh2_error(session,-6,"Unable to allocate memory for private key data");
  return iVar5;
}

Assistant:

static int
gen_publickey_from_dsa_evp(LIBSSH2_SESSION *session,
                           unsigned char **method,
                           size_t *method_len,
                           unsigned char **pubkeydata,
                           size_t *pubkeydata_len,
                           EVP_PKEY *pk)
{
    DSA*           dsa = NULL;
    unsigned char* key;
    unsigned char* method_buf = NULL;
    size_t  key_len;

    _libssh2_debug(session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from DSA private key envelop");

    dsa = EVP_PKEY_get1_DSA(pk);
    if (dsa == NULL) {
        /* Assume memory allocation error... what else could it be ? */
        goto __alloc_error;
    }

    method_buf = LIBSSH2_ALLOC(session, 7);  /* ssh-dss. */
    if (method_buf == NULL) {
        goto __alloc_error;
    }

    key = gen_publickey_from_dsa(session, dsa, &key_len);
    if (key == NULL) {
        goto __alloc_error;
    }
    DSA_free(dsa);

    memcpy(method_buf, "ssh-dss", 7);
    *method         = method_buf;
    *method_len     = 7;
    *pubkeydata     = key;
    *pubkeydata_len = key_len;
    return 0;

  __alloc_error:
    if (dsa != NULL) {
        DSA_free(dsa);
    }
    if (method_buf != NULL) {
        LIBSSH2_FREE(session, method_buf);
    }

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}